

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

int __thiscall
ssllabs::SSLlabs::analyze
          (SSLlabs *this,string *domain,string *data,bool publish,bool startNew,bool fromCache,
          bool ignoreMismatch)

{
  int iVar1;
  allocator local_59;
  string *local_58;
  string command;
  
  local_58 = data;
  std::__cxx11::string::string((string *)&command,"/analyze?host=",&local_59);
  std::__cxx11::string::append((string *)&command);
  if (startNew && fromCache) {
    std::operator<<((ostream *)&std::cerr,"could not use startNew and fromCache at the same time\n")
    ;
    iVar1 = -1;
  }
  else {
    if (publish) {
      std::__cxx11::string::append((char *)&command);
    }
    if (startNew) {
      std::__cxx11::string::append((char *)&command);
    }
    if (ignoreMismatch || fromCache) {
      std::__cxx11::string::append((char *)&command);
    }
    iVar1 = curl_read(this,&command,local_58);
  }
  std::__cxx11::string::~string((string *)&command);
  return iVar1;
}

Assistant:

int SSLlabs::analyze(const std::string domain, const std::string &data,
                         bool publish, bool startNew, bool fromCache, bool ignoreMismatch) {
        std::string command("/analyze?host=");

        command += domain;
        if (startNew && fromCache) {
            std::cerr << "could not use startNew and fromCache at the same time\n";
            return -1;
        }

        if (publish) {
            command += "&publish=on";
        }

        if (startNew) {
            command += "&startNew=on";
        }

        if (fromCache) {
            command += "&fromCache=on";
        }
        else {
            if (ignoreMismatch) {
                command += "&ignoreMismatch=on";
            }
        }

        return curl_read(command, data);
    }